

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O0

int qc_staticlist_add_at(QcStaticList *staticList,int previous_cell,int cell)

{
  int cell_00;
  int *piVar1;
  void *pvVar2;
  int *piVar3;
  _StaticCell *nextCell;
  _StaticCell *preCell;
  _StaticCell *curCell;
  int next;
  int cell_local;
  int previous_cell_local;
  QcStaticList *staticList_local;
  
  if (staticList == (QcStaticList *)0x0) {
    staticList_local._4_4_ = -1;
  }
  else if ((previous_cell < 0) || (staticList->limit <= previous_cell)) {
    staticList_local._4_4_ = -1;
  }
  else if ((cell < 0) || (staticList->limit <= cell)) {
    staticList_local._4_4_ = -1;
  }
  else if (staticList->head == -99) {
    staticList_local._4_4_ = -99;
  }
  else {
    piVar1 = (int *)get_staticlist_cell(staticList,cell);
    pvVar2 = get_staticlist_cell(staticList,previous_cell);
    cell_00 = *(int *)((long)pvVar2 + 4);
    if (cell_00 == -99) {
      *(int *)((long)pvVar2 + 4) = cell;
      *piVar1 = previous_cell;
      piVar1[1] = -99;
      staticList->tail = cell;
    }
    else {
      piVar3 = (int *)get_staticlist_cell(staticList,cell_00);
      *(int *)((long)pvVar2 + 4) = cell;
      *piVar3 = cell;
      *piVar1 = previous_cell;
      piVar1[1] = cell_00;
    }
    staticList->num = staticList->num + 1;
    staticList_local._4_4_ = cell;
  }
  return staticList_local._4_4_;
}

Assistant:

int qc_staticlist_add_at(QcStaticList *staticList, int previous_cell, int cell)
{
    int next;
    _StaticCell *curCell, *preCell, *nextCell;

    if(NULL == staticList)
        return -1;

    if(previous_cell<0 || previous_cell>=staticList->limit)
        return -1;

    if(cell<0 || cell>=staticList->limit)
        return -1;

    if(staticList->head == QC_INVALID_INT)
        return QC_INVALID_INT;

    curCell = get_staticlist_cell(staticList, cell);
    preCell=get_staticlist_cell(staticList, previous_cell);
    next=preCell->next;

    if(next!= QC_INVALID_INT)
    {
       nextCell=get_staticlist_cell(staticList, next);
       preCell->next=cell;
       nextCell->previous=cell;
       curCell->previous=previous_cell;
       curCell->next=next;
    }
    else
    {
       preCell->next=cell;
       curCell->previous=previous_cell;
       curCell->next=QC_INVALID_INT;
       staticList->tail=cell;
    }
    staticList->num ++;

    return cell;
}